

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O1

iterator_element * __thiscall
Disa::Matrix_Sparse::erase
          (iterator_element *__return_storage_ptr__,Matrix_Sparse *this,
          Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *iter_element)

{
  size_t *i_row;
  pointer *ppuVar1;
  pointer *ppdVar2;
  pointer value;
  long lVar3;
  pointer puVar4;
  pointer pvVar5;
  pointer pdVar6;
  pointer pdVar7;
  bool bVar8;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  source_location *location;
  pointer puVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  pointer __src;
  pointer pdVar13;
  size_type *i_column;
  Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> local_b8;
  undefined1 local_98 [32];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined **local_38;
  
  end((Matrix_Sparse *)&local_58);
  lVar3 = *(long *)(*(long *)local_58._M_dataplus._M_p + 8 + local_58._M_string_length * 8);
  location = (source_location *)
             ((((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (local_58._M_dataplus._M_p + 0x18))->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start + lVar3);
  Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
            ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_98,
             (matrix_type *)local_58._M_dataplus._M_p,&local_58._M_string_length,
             (size_type *)location,
             (((vector<double,_std::allocator<double>_> *)(local_58._M_dataplus._M_p + 0x30))->
             super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
             _M_start + lVar3);
  if ((((iter_element->matrix != (matrix_type *)local_98._24_8_) ||
       (iter_element->row_index != local_98._16_8_)) ||
      (iter_element->column_index != (size_type *)local_98._0_8_)) ||
     (iter_element->value != (pointer)local_98._8_8_)) {
    i_row = &iter_element->row_index;
    operator[]((Matrix_Sparse *)&local_78,(size_t *)this);
    lVar3 = *(long *)(*(long *)local_78._M_dataplus._M_p + 8 + local_78._M_string_length * 8);
    location = (source_location *)
               ((((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (local_78._M_dataplus._M_p + 0x18))->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start + lVar3);
    Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
              (&local_b8,(matrix_type *)local_78._M_dataplus._M_p,&local_78._M_string_length,
               (size_type *)location,
               (((vector<double,_std::allocator<double>_> *)(local_78._M_dataplus._M_p + 0x30))->
               super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
               _M_start + lVar3);
    if (((iter_element->matrix != local_b8.matrix) || (*i_row != local_b8.row_index)) ||
       ((iter_element->column_index != local_b8.column_index ||
        (iter_element->value != local_b8.value)))) {
      bVar8 = contains(this,i_row,iter_element->column_index);
      if (bVar8) {
        puVar4 = (this->row_non_zero).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar11 = (this->row_non_zero).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start + *i_row;
        while (puVar11 = puVar11 + 1, puVar11 < puVar4) {
          *puVar11 = *puVar11 - 1;
        }
        pvVar5 = iter_element->value;
        pdVar13 = (this->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar11 = (this->column_index).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar4 = (this->column_index).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        __src = (pointer)((long)pvVar5 + (long)puVar11 + (8 - (long)pdVar13));
        i_column = (size_type *)((long)pvVar5 + ((long)puVar11 - (long)pdVar13));
        if (__src != puVar4) {
          memmove(i_column,__src,(long)puVar4 - (long)__src);
        }
        ppuVar1 = &(this->column_index).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + -1;
        pdVar6 = (this->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (this->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        value = (pointer)((long)pvVar5 + ((long)pdVar6 - (long)pdVar13));
        pdVar13 = (pointer)((long)pvVar5 + (long)pdVar6 + (8 - (long)pdVar13));
        if (pdVar13 != pdVar7) {
          memmove(value,pdVar13,(long)pdVar7 - (long)pdVar13);
        }
        ppdVar2 = &(this->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppdVar2 = *ppdVar2 + -1;
        Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
                  (__return_storage_ptr__,this,i_row,i_column,value);
        return __return_storage_ptr__;
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_38 = &PTR_s__workspace_llm4binary_github_lic_0018cdd8;
  console_format_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
             (Disa *)0x0,(Log_Level)&local_38,location);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_98._0_8_,local_98._8_8_);
  row_column_abi_cxx11_
            (&local_78,(Matrix_Sparse *)iter_element->row_index,*iter_element->column_index,
             (size_t)location);
  std::operator+(&local_58,"Entry [",&local_78);
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_58,"] does not exist.");
  local_b8.column_index = (size_type *)(pbVar10->_M_dataplus)._M_p;
  paVar12 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.column_index == paVar12) {
    local_b8.row_index = paVar12->_M_allocated_capacity;
    local_b8.matrix = *(matrix_type **)((long)&pbVar10->field_2 + 8);
    local_b8.column_index = &local_b8.row_index;
  }
  else {
    local_b8.row_index = paVar12->_M_allocated_capacity;
  }
  local_b8.value = (pointer)pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(char *)local_b8.column_index,(long)local_b8.value);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_98);
  exit(1);
}

Assistant:

Matrix_Sparse::iterator_element Matrix_Sparse::erase(
const Iterator_Matrix_Sparse_Element<Matrix_Sparse>& iter_element) {
  ASSERT_DEBUG(iter_element != end()->end() && iter_element != (*this)[iter_element.i_row()].end() &&
               contains(iter_element.i_row(), iter_element.i_column()),
               "Entry [" + row_column(iter_element.i_row(), iter_element.i_column()) + "] does not exist.");
  for(auto non_zeros = std::next(row_non_zero.begin(), static_cast<s_size_t>(iter_element.i_row() + 1));
      non_zeros < row_non_zero.end(); --(*non_zeros++))
    ;
  const auto distance = std::distance(&*element_value.cbegin(), &*iter_element);
  return {this, iter_element.i_row(), &*(column_index.erase(column_index.begin() + distance)),
          &*(element_value.erase(element_value.begin() + distance))};
}